

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::ExactCompareEdgeDirections(Vector3_xf *a0,Vector3_xf *a1,Vector3_xf *b0,Vector3_xf *b1)

{
  bool bVar1;
  int iVar2;
  int local_90;
  uint local_8c;
  BigNum local_88;
  Vector3<ExactFloat> local_80;
  Vector3<ExactFloat> local_50;
  
  bVar1 = ArePointsAntipodal(a0,a1);
  if (bVar1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x316,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_80.c_[0].bn_.bn_,"Check failed: !ArePointsAntipodal(a0, a1) ");
  }
  else {
    bVar1 = ArePointsAntipodal(b0,b1);
    if (!bVar1) {
      Vector3<ExactFloat>::CrossProd(&local_80,a0,a1);
      Vector3<ExactFloat>::CrossProd(&local_50,b0,b1);
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,&local_80);
      iVar2 = 0;
      if ((local_8c & 0xfffffffd) != 0x7ffffffd) {
        iVar2 = local_90;
      }
      ExactFloat::BigNum::~BigNum(&local_88);
      Vector3<ExactFloat>::~Vector3(&local_50);
      Vector3<ExactFloat>::~Vector3(&local_80);
      return iVar2;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x317,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_80.c_[0].bn_.bn_,"Check failed: !ArePointsAntipodal(b0, b1) ");
  }
  abort();
}

Assistant:

int ExactCompareEdgeDirections(const Vector3_xf& a0, const Vector3_xf& a1,
                               const Vector3_xf& b0, const Vector3_xf& b1) {
  S2_DCHECK(!ArePointsAntipodal(a0, a1));
  S2_DCHECK(!ArePointsAntipodal(b0, b1));
  return a0.CrossProd(a1).DotProd(b0.CrossProd(b1)).sgn();
}